

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectPoller.cpp
# Opt level: O3

void __thiscall sznet::net::SelectPoller::removeChannel(SelectPoller *this,Channel *channel)

{
  _Rb_tree_header *p_Var1;
  ChannelMap *this_00;
  int iVar2;
  EventLoop *this_01;
  size_t sVar3;
  pointer pEVar4;
  Event_t EVar5;
  bool bVar6;
  mapped_type *ppCVar7;
  pointer pEVar8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  long lVar11;
  SourceFile file;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_sznet::net::Channel_*>_>,_std::_Rb_tree_iterator<std::pair<const_int,_sznet::net::Channel_*>_>_>
  pVar12;
  undefined1 local_ff8 [8];
  sz_fd channelAtEndFd;
  char *local_48;
  
  this_01 = (this->super_Poller).m_ownerLoop;
  bVar6 = EventLoop::isInLoopThread(this_01);
  if (!bVar6) {
    EventLoop::abortNotInLoopThread(this_01);
  }
  if (g_logLevel < 1) {
    file._8_8_ = 0x10;
    file.m_data = "SelectPoller.cpp";
    Logger::Logger((Logger *)local_ff8,file,0x8e,TRACE,"removeChannel");
    if (5 < (uint)((int)&stack0xffffffffffffffb8 - (int)local_48)) {
      builtin_strncpy(local_48,"fd = ",5);
      local_48 = local_48 + 5;
    }
    LogStream::operator<<((LogStream *)&channelAtEndFd,channel->m_fd);
    Logger::~Logger((Logger *)local_ff8);
  }
  p_Var9 = (this->super_Poller).m_channels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var9 != (_Base_ptr)0x0) {
    local_ff8._0_4_ = channel->m_fd;
    p_Var1 = &(this->super_Poller).m_channels._M_t._M_impl.super__Rb_tree_header;
    this_00 = &(this->super_Poller).m_channels;
    p_Var10 = &p_Var1->_M_header;
    do {
      if ((int)local_ff8._0_4_ <= (int)p_Var9[1]._M_color) {
        p_Var10 = p_Var9;
      }
      p_Var9 = (&p_Var9->_M_left)[(int)p_Var9[1]._M_color < (int)local_ff8._0_4_];
    } while (p_Var9 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var10 != p_Var1) && ((int)p_Var10[1]._M_color <= (int)local_ff8._0_4_)
       ) {
      ppCVar7 = std::
                map<int,_sznet::net::Channel_*,_std::less<int>,_std::allocator<std::pair<const_int,_sznet::net::Channel_*>_>_>
                ::operator[](this_00,(key_type *)local_ff8);
      if (*ppCVar7 != channel) {
        __assert_fail("m_channels[channel->fd()] == channel",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                      ,0x90,"virtual void sznet::net::SelectPoller::removeChannel(Channel *)");
      }
      if (channel->m_events != 0) {
        __assert_fail("channel->isNoneEvent()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                      ,0x91,"virtual void sznet::net::SelectPoller::removeChannel(Channel *)");
      }
      iVar2 = channel->m_index;
      lVar11 = (long)iVar2;
      if ((lVar11 < 0) ||
         (pEVar8 = (this->m_pollfds).
                   super__Vector_base<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
                   ._M_impl.super__Vector_impl_data._M_start,
         (int)((ulong)((long)(this->m_pollfds).
                             super__Vector_base<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar8) >> 3) <=
         iVar2)) {
        __assert_fail("0 <= idx && idx < static_cast<int>(m_pollfds.size())",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                      ,0x93,"virtual void sznet::net::SelectPoller::removeChannel(Channel *)");
      }
      if (pEVar8[lVar11].ev != 0) {
        __assert_fail("event.ev == channel->events()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                      ,0x95,"virtual void sznet::net::SelectPoller::removeChannel(Channel *)");
      }
      local_ff8._0_4_ = channel->m_fd;
      pVar12 = std::
               _Rb_tree<int,_std::pair<const_int,_sznet::net::Channel_*>,_std::_Select1st<std::pair<const_int,_sznet::net::Channel_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_sznet::net::Channel_*>_>_>
               ::equal_range(&this_00->_M_t,(key_type *)local_ff8);
      sVar3 = (this->super_Poller).m_channels._M_t._M_impl.super__Rb_tree_header._M_node_count;
      std::
      _Rb_tree<int,_std::pair<const_int,_sznet::net::Channel_*>,_std::_Select1st<std::pair<const_int,_sznet::net::Channel_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_sznet::net::Channel_*>_>_>
      ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar12.first._M_node,(_Base_ptr)pVar12.second._M_node
                    );
      if (sVar3 - (this->super_Poller).m_channels._M_t._M_impl.super__Rb_tree_header._M_node_count
          == 1) {
        pEVar8 = (this->m_pollfds).
                 super__Vector_base<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pEVar4 = (this->m_pollfds).
                 super__Vector_base<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (((long)pEVar8 - (long)pEVar4 >> 3) + -1 != lVar11) {
          local_ff8._0_4_ = pEVar8[-1].fd;
          EVar5 = pEVar4[lVar11];
          pEVar4[lVar11] = pEVar8[-1];
          pEVar8[-1] = EVar5;
          ppCVar7 = std::
                    map<int,_sznet::net::Channel_*,_std::less<int>,_std::allocator<std::pair<const_int,_sznet::net::Channel_*>_>_>
                    ::operator[](this_00,(key_type *)local_ff8);
          (*ppCVar7)->m_index = iVar2;
          pEVar8 = (this->m_pollfds).
                   super__Vector_base<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        (this->m_pollfds).
        super__Vector_base<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
        ._M_impl.super__Vector_impl_data._M_finish = pEVar8 + -1;
        return;
      }
      __assert_fail("n == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                    ,0x99,"virtual void sznet::net::SelectPoller::removeChannel(Channel *)");
    }
  }
  __assert_fail("m_channels.find(channel->fd()) != m_channels.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                ,0x8f,"virtual void sznet::net::SelectPoller::removeChannel(Channel *)");
}

Assistant:

void SelectPoller::removeChannel(Channel* channel)
{
	Poller::assertInLoopThread();
	LOG_TRACE << "fd = " << channel->fd();
	assert(m_channels.find(channel->fd()) != m_channels.end());
	assert(m_channels[channel->fd()] == channel);
	assert(channel->isNoneEvent());
	int idx = channel->index();
	assert(0 <= idx && idx < static_cast<int>(m_pollfds.size()));
	const Channel::Event_t& event = m_pollfds[idx];
	assert(event.ev == channel->events());
	(void)event;
	// 移除
	size_t n = m_channels.erase(channel->fd());
	assert(n == 1); 
	(void)n;
	if (implicit_cast<size_t>(idx) == m_pollfds.size() - 1)
	{
		m_pollfds.pop_back();
	}
	else
	{
		auto channelAtEndFd = m_pollfds.back().fd;
		// 不要影响其他channel的下标
		std::iter_swap(m_pollfds.begin() + idx, m_pollfds.end() - 1);
		// 因为交换了位置，所以index发生了变化
		m_channels[channelAtEndFd]->set_index(idx);
		m_pollfds.pop_back();
	}
}